

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Sintatico::parametros_formais(Sintatico *this)

{
  bool bVar1;
  int token_consumir;
  int token_consumir_00;
  
  token_consumir_00 = 0xc;
  bVar1 = Tokens::isEqual((Tokens *)this,this->tok,0xc);
  if (bVar1) {
    token_consumir = 0xd;
    do {
      eat(this,token_consumir_00);
      parametro_expressao(this);
      bVar1 = Tokens::isEqual((Tokens *)this,this->tok,0x15);
      token_consumir_00 = 0x15;
    } while (bVar1);
  }
  else {
    token_consumir = 0x19;
  }
  eat(this,token_consumir);
  return;
}

Assistant:

void Sintatico::parametros_formais() {
  if (isEqual(tok, ABREPAR)){
    eat(ABREPAR);
    parametro_formal();
    while (isEqual(tok, PONTOVIRGULA)) {
      eat(PONTOVIRGULA);
      parametro_formal();
    }
    eat(FECHAPAR);
  } else eat(ABREFECHAPAR);
}